

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_student.cpp
# Opt level: O0

void use_student(void)

{
  ostream *poVar1;
  void *this;
  double dVar2;
  Student *local_d8;
  int local_90;
  int i;
  undefined1 local_78 [8];
  Student list [2];
  int num_quiz;
  int num_student;
  
  L14_1::Student::Student((Student *)local_78,3);
  L14_1::Student::Student((Student *)&list[0]._scores._M_data,3);
  for (local_90 = 0; local_90 < 2; local_90 = local_90 + 1) {
    set_student((Student *)&list[(long)local_90 + -1]._scores._M_data,3);
  }
  std::operator<<((ostream *)&std::cout,"\nResult:\n");
  for (local_90 = 0; local_90 < 2; local_90 = local_90 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    L14_1::operator<<(poVar1,(Student *)&list[(long)local_90 + -1]._scores._M_data);
    poVar1 = std::operator<<((ostream *)&std::cout,"average: ");
    dVar2 = L14_1::Student::get_average((Student *)&list[(long)local_90 + -1]._scores._M_data);
    this = (void *)std::ostream::operator<<(poVar1,dVar2);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"Done!\n");
  local_d8 = (Student *)&list[1]._scores._M_data;
  do {
    local_d8 = local_d8 + -1;
    L14_1::Student::~Student(local_d8);
  } while (local_d8 != (Student *)local_78);
  return;
}

Assistant:

void use_student() {
    using namespace L14_1;

    const int num_student = 2;
    const int num_quiz = 3;

    Student list[num_student] = {
            Student(num_quiz),
            Student(num_quiz),
    };
    int i = 0;
    for (i = 0; i < num_student; i++) {
        set_student(list[i], num_quiz);
    }

    std::cout << "\nResult:\n";
    for (i = 0; i < num_student; i++) {
        std::cout << std::endl << list[i];
        std::cout << "average: " << list[i].get_average() << std::endl;
    }
    std::cout << "Done!\n";
}